

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestMemCheckCommand::InitializeActualHandler(cmCTestMemCheckCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  cmCTestGenericHandler *pcVar3;
  allocator local_41;
  string local_40;
  
  pcVar3 = cmCTest::GetInitializedHandler
                     ((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.
                      super_cmCTestCommand.CTest,"memcheck");
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_40,"CTEST_MEMORYCHECK_TYPE",&local_41);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckType",&local_40,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_40,"CTEST_MEMORYCHECK_SANITIZER_OPTIONS",&local_41);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckSanitizerOptions",&local_40,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_40,"CTEST_MEMORYCHECK_COMMAND",&local_41);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckCommand",&local_40,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_40,"CTEST_MEMORYCHECK_COMMAND_OPTIONS",&local_41);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckCommandOptions",&local_40,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  std::__cxx11::string::string((string *)&local_40,"CTEST_MEMORYCHECK_SUPPRESSIONS_FILE",&local_41);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"MemoryCheckSuppressionFile",&local_40,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  std::__cxx11::string::~string((string *)&local_40);
  pcVar3->Quiet = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet;
  return pcVar3;
}

Assistant:

cmCTestGenericHandler* cmCTestMemCheckCommand::InitializeActualHandler()
{
  cmCTestGenericHandler* handler
    = this->CTest->GetInitializedHandler("memcheck");

  this->CTest->SetCTestConfigurationFromCMakeVariable(this->Makefile,
    "MemoryCheckType", "CTEST_MEMORYCHECK_TYPE", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(this->Makefile,
    "MemoryCheckSanitizerOptions", "CTEST_MEMORYCHECK_SANITIZER_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(this->Makefile,
    "MemoryCheckCommand", "CTEST_MEMORYCHECK_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(this->Makefile,
    "MemoryCheckCommandOptions", "CTEST_MEMORYCHECK_COMMAND_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(this->Makefile,
    "MemoryCheckSuppressionFile", "CTEST_MEMORYCHECK_SUPPRESSIONS_FILE",
    this->Quiet);

  handler->SetQuiet(this->Quiet);
  return handler;
}